

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O3

int mixed_make_segment_chain(mixed_segment *segment)

{
  void *pvVar1;
  
  pvVar1 = (*mixed_calloc)(1,0x10);
  if (pvVar1 == (void *)0x0) {
    mixed_err(1);
  }
  else {
    segment->free = chain_segment_free;
    segment->start = chain_segment_start;
    segment->mix = chain_segment_mix;
    segment->end = chain_segment_end;
    segment->set_in = chain_segment_set_in;
    segment->set_out = chain_segment_set_out;
    segment->info = chain_segment_info;
    segment->get = chain_segment_get;
    segment->set = chain_segment_set;
    segment->data = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

MIXED_EXPORT int mixed_make_segment_chain(struct mixed_segment *segment){
  struct vector *data = mixed_calloc(1, sizeof(struct vector));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  
  segment->free = chain_segment_free;
  segment->start = chain_segment_start;
  segment->mix = chain_segment_mix;
  segment->end = chain_segment_end;
  segment->set_in = chain_segment_set_in;
  segment->set_out = chain_segment_set_out;
  segment->info = chain_segment_info;
  segment->get = chain_segment_get;
  segment->set = chain_segment_set;
  segment->data = data;
  return 1;
}